

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

void __thiscall pybind11::object::~object(object *this)

{
  object *this_local;
  
  handle::dec_ref(&this->super_handle);
  return;
}

Assistant:

~object() { dec_ref(); }